

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O1

void __thiscall cmServer::RegisterProtocol(cmServer *this,cmServerProtocol *protocol)

{
  pointer *pppcVar1;
  cmServerProtocol **ppcVar2;
  iterator __position;
  int iVar3;
  int iVar4;
  int extraout_var;
  int extraout_var_00;
  int extraout_var_01;
  int extraout_var_02;
  int extraout_var_03;
  int extraout_var_04;
  int extraout_var_05;
  int extraout_var_06;
  long lVar5;
  cmServerProtocol **ppcVar6;
  cmServerProtocol **ppcVar7;
  cmServerProtocol *local_38;
  
  local_38 = protocol;
  iVar3 = (*protocol->_vptr_cmServerProtocol[3])(protocol);
  if (((char)iVar3 != '\0') && (this->SupportExperimental == false)) {
    if (local_38 == (cmServerProtocol *)0x0) {
      return;
    }
    (*local_38->_vptr_cmServerProtocol[1])();
    return;
  }
  iVar3 = (*local_38->_vptr_cmServerProtocol[2])();
  if (iVar3 < 0) {
    __assert_fail("version.first >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmServer.cxx"
                  ,0x7c,"void cmServer::RegisterProtocol(cmServerProtocol *)");
  }
  if (extraout_var < 0) {
    __assert_fail("version.second >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmServer.cxx"
                  ,0x7d,"void cmServer::RegisterProtocol(cmServerProtocol *)");
  }
  ppcVar6 = (this->SupportedProtocols).
            super__Vector_base<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppcVar2 = (this->SupportedProtocols).
            super__Vector_base<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  lVar5 = (long)ppcVar2 - (long)ppcVar6 >> 5;
  if (0 < lVar5) {
    lVar5 = lVar5 + 1;
    ppcVar6 = ppcVar6 + 2;
    do {
      ppcVar7 = ppcVar6;
      iVar4 = (*ppcVar7[-2]->_vptr_cmServerProtocol[2])();
      if ((iVar3 == iVar4) && (extraout_var == extraout_var_00)) {
        ppcVar7 = ppcVar7 + -2;
        goto LAB_0014439d;
      }
      iVar4 = (*ppcVar7[-1]->_vptr_cmServerProtocol[2])();
      if ((iVar3 == iVar4) && (extraout_var == extraout_var_01)) {
        ppcVar7 = ppcVar7 + -1;
        goto LAB_0014439d;
      }
      iVar4 = (*(*ppcVar7)->_vptr_cmServerProtocol[2])();
      if ((iVar3 == iVar4) && (extraout_var == extraout_var_02)) goto LAB_0014439d;
      iVar4 = (*ppcVar7[1]->_vptr_cmServerProtocol[2])();
      if ((iVar3 == iVar4) && (extraout_var == extraout_var_03)) {
        ppcVar7 = ppcVar7 + 1;
        goto LAB_0014439d;
      }
      lVar5 = lVar5 + -1;
      ppcVar6 = ppcVar7 + 4;
    } while (1 < lVar5);
    ppcVar6 = ppcVar7 + 2;
  }
  lVar5 = (long)ppcVar2 - (long)ppcVar6 >> 3;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      ppcVar7 = ppcVar2;
      if ((lVar5 != 3) ||
         ((iVar4 = (*(*ppcVar6)->_vptr_cmServerProtocol[2])(), iVar3 == iVar4 &&
          (ppcVar7 = ppcVar6, extraout_var == extraout_var_04)))) goto LAB_0014439d;
      ppcVar6 = ppcVar6 + 1;
    }
    iVar4 = (*(*ppcVar6)->_vptr_cmServerProtocol[2])();
    if ((iVar3 == iVar4) && (ppcVar7 = ppcVar6, extraout_var == extraout_var_05)) goto LAB_0014439d;
    ppcVar6 = ppcVar6 + 1;
  }
  iVar4 = (*(*ppcVar6)->_vptr_cmServerProtocol[2])();
  if (extraout_var != extraout_var_06) {
    ppcVar6 = ppcVar2;
  }
  ppcVar7 = ppcVar6;
  if (iVar3 != iVar4) {
    ppcVar7 = ppcVar2;
  }
LAB_0014439d:
  __position._M_current =
       (this->SupportedProtocols).
       super__Vector_base<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (ppcVar7 == __position._M_current) {
    if (__position._M_current ==
        (this->SupportedProtocols).
        super__Vector_base<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<cmServerProtocol*,std::allocator<cmServerProtocol*>>::
      _M_realloc_insert<cmServerProtocol*const&>
                ((vector<cmServerProtocol*,std::allocator<cmServerProtocol*>> *)
                 &this->SupportedProtocols,__position,&local_38);
    }
    else {
      *__position._M_current = local_38;
      pppcVar1 = &(this->SupportedProtocols).
                  super__Vector_base<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppcVar1 = *pppcVar1 + 1;
    }
  }
  return;
}

Assistant:

void cmServer::RegisterProtocol(cmServerProtocol* protocol)
{
  if (protocol->IsExperimental() && !this->SupportExperimental) {
    delete protocol;
    return;
  }
  auto version = protocol->ProtocolVersion();
  assert(version.first >= 0);
  assert(version.second >= 0);
  auto it = std::find_if(this->SupportedProtocols.begin(),
                         this->SupportedProtocols.end(),
                         [version](cmServerProtocol* p) {
                           return p->ProtocolVersion() == version;
                         });
  if (it == this->SupportedProtocols.end()) {
    this->SupportedProtocols.push_back(protocol);
  }
}